

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void CoreML::Specification::MILSpec::protobuf_MIL_2eproto::TableStruct::InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O3/mlmodel/format/MIL.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  DAT_0041f0d8 = (undefined8 *)0x0;
  _DAT_0041f0e0 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_0041f0e8 = (undefined8 *)0x0;
  uRam000000000041f0f0 = 0;
  _DAT_0041f0f8 = 0;
  _Program_FunctionsEntry_default_instance_ = &PTR__MapEntryImpl_00418230;
  DAT_0041f100 = 1;
  DAT_0041f110 = (undefined8 *)0x0;
  _DAT_0041f118 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_0041f120 = (undefined8 *)0x0;
  uRam000000000041f128 = 0;
  _DAT_0041f130 = 0;
  _Program_AttributesEntry_default_instance_ = &PTR__MapEntryImpl_004183b0;
  DAT_0041f138 = 1;
  Program::Program((Program *)&_Program_default_instance_);
  DAT_0041f1a8 = 1;
  DAT_0041f1b8 = (undefined8 *)0x0;
  _DAT_0041f1c0 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_0041f1c8 = (undefined8 *)0x0;
  uRam000000000041f1d0 = 0;
  _DAT_0041f1d8 = 0;
  _Function_BlockSpecializationsEntry_default_instance_ = &PTR__MapEntryImpl_00418530;
  DAT_0041f1e0 = 1;
  DAT_0041f1f0 = (undefined8 *)0x0;
  _DAT_0041f1f8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_0041f200 = (undefined8 *)0x0;
  uRam000000000041f208 = 0;
  _DAT_0041f210 = 0;
  _Function_AttributesEntry_default_instance_ = &PTR__MapEntryImpl_004183b0;
  DAT_0041f218 = 1;
  Function::Function((Function *)&_Function_default_instance_);
  DAT_0041f298 = 1;
  DAT_0041f2a8 = (undefined8 *)0x0;
  _DAT_0041f2b0 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_0041f2b8 = (undefined8 *)0x0;
  uRam000000000041f2c0 = 0;
  _DAT_0041f2c8 = 0;
  _Block_AttributesEntry_default_instance_ = &PTR__MapEntryImpl_004183b0;
  DAT_0041f2d0 = 1;
  Block::Block((Block *)&_Block_default_instance_);
  DAT_0041f358 = 1;
  Argument_Binding::Argument_Binding((Argument_Binding *)&_Argument_Binding_default_instance_);
  DAT_0041f380 = 1;
  Argument::Argument((Argument *)&_Argument_default_instance_);
  DAT_0041f3c8 = 1;
  DAT_0041f3d8 = (undefined8 *)0x0;
  _DAT_0041f3e0 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_0041f3e8 = (undefined8 *)0x0;
  uRam000000000041f3f0 = 0;
  _DAT_0041f3f8 = 0;
  _Operation_InputsEntry_default_instance_ = &PTR__MapEntryImpl_004186b0;
  DAT_0041f400 = 1;
  DAT_0041f410 = (undefined8 *)0x0;
  _DAT_0041f418 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_0041f420 = (undefined8 *)0x0;
  uRam000000000041f428 = 0;
  _DAT_0041f430 = 0;
  _Operation_AttributesEntry_default_instance_ = &PTR__MapEntryImpl_004183b0;
  DAT_0041f438 = 1;
  Operation::Operation((Operation *)&_Operation_default_instance_);
  DAT_0041f4d0 = 1;
  NamedValueType::NamedValueType((NamedValueType *)&_NamedValueType_default_instance_);
  DAT_0041f500 = 1;
  ValueType::ValueType((ValueType *)&_ValueType_default_instance_);
  DAT_0041f528 = 1;
  DAT_0041f558 = (undefined8 *)0x0;
  _DAT_0041f560 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_0041f568 = (undefined8 *)0x0;
  uRam000000000041f570 = 0;
  _DAT_0041f578 = 0;
  _TensorType_AttributesEntry_default_instance_ = &PTR__MapEntryImpl_004183b0;
  DAT_0041f580 = 1;
  TensorType::TensorType((TensorType *)&_TensorType_default_instance_);
  DAT_0041f5e0 = 1;
  TupleType::TupleType((TupleType *)&_TupleType_default_instance_);
  DAT_0041f618 = 1;
  ListType::ListType((ListType *)&_ListType_default_instance_);
  DAT_0041f648 = 1;
  DictionaryType::DictionaryType((DictionaryType *)&_DictionaryType_default_instance_);
  DAT_0041f678 = 1;
  Dimension_ConstantDimension::Dimension_ConstantDimension
            ((Dimension_ConstantDimension *)&_Dimension_ConstantDimension_default_instance_);
  DAT_0041f6a0 = 1;
  Dimension_UnknownDimension::Dimension_UnknownDimension
            ((Dimension_UnknownDimension *)&_Dimension_UnknownDimension_default_instance_);
  DAT_0041f6c0 = 1;
  Dimension::Dimension((Dimension *)&_Dimension_default_instance_);
  DAT_0041f6e8 = 1;
  Value_ImmediateValue::Value_ImmediateValue
            ((Value_ImmediateValue *)&_Value_ImmediateValue_default_instance_);
  DAT_0041f720 = 1;
  Value_BlobFileValue::Value_BlobFileValue
            ((Value_BlobFileValue *)&_Value_BlobFileValue_default_instance_);
  DAT_0041f770 = 1;
  Value::Value((Value *)&_Value_default_instance_);
  DAT_0041f7a8 = 1;
  TensorValue_RepeatedFloats::TensorValue_RepeatedFloats
            ((TensorValue_RepeatedFloats *)&_TensorValue_RepeatedFloats_default_instance_);
  DAT_0041f7e8 = 1;
  TensorValue_RepeatedDoubles::TensorValue_RepeatedDoubles
            ((TensorValue_RepeatedDoubles *)&_TensorValue_RepeatedDoubles_default_instance_);
  DAT_0041f818 = 1;
  TensorValue_RepeatedInts::TensorValue_RepeatedInts
            ((TensorValue_RepeatedInts *)&_TensorValue_RepeatedInts_default_instance_);
  DAT_0041f848 = 1;
  TensorValue_RepeatedLongInts::TensorValue_RepeatedLongInts
            ((TensorValue_RepeatedLongInts *)&_TensorValue_RepeatedLongInts_default_instance_);
  DAT_0041f878 = 1;
  TensorValue_RepeatedBools::TensorValue_RepeatedBools
            ((TensorValue_RepeatedBools *)&_TensorValue_RepeatedBools_default_instance_);
  DAT_0041f8a8 = 1;
  TensorValue_RepeatedStrings::TensorValue_RepeatedStrings
            ((TensorValue_RepeatedStrings *)&_TensorValue_RepeatedStrings_default_instance_);
  DAT_0041f8e0 = 1;
  TensorValue_RepeatedBytes::TensorValue_RepeatedBytes
            ((TensorValue_RepeatedBytes *)&_TensorValue_RepeatedBytes_default_instance_);
  DAT_0041f908 = 1;
  TensorValue::TensorValue((TensorValue *)&_TensorValue_default_instance_);
  DAT_0041f930 = 1;
  TupleValue::TupleValue((TupleValue *)&_TupleValue_default_instance_);
  DAT_0041f9a0 = 1;
  ListValue::ListValue((ListValue *)&_ListValue_default_instance_);
  DAT_0041f9d8 = 1;
  DictionaryValue_KeyValuePair::DictionaryValue_KeyValuePair
            ((DictionaryValue_KeyValuePair *)&_DictionaryValue_KeyValuePair_default_instance_);
  DAT_0041fa08 = 1;
  DictionaryValue::DictionaryValue((DictionaryValue *)&_DictionaryValue_default_instance_);
  DAT_0041f0d8 = &_Program_FunctionsEntry_default_instance_;
  DAT_0041f0e8 = &_Function_default_instance_;
  DAT_0041f1b8 = &_Function_BlockSpecializationsEntry_default_instance_;
  DAT_0041f1c8 = &_Block_default_instance_;
  DAT_0041f3d8 = &_Operation_InputsEntry_default_instance_;
  DAT_0041f3e8 = &_Argument_default_instance_;
  DAT_0041f630 = &_ValueType_default_instance_;
  DAT_0041f638 = &_Dimension_default_instance_;
  DAT_0041f110 = &_Program_AttributesEntry_default_instance_;
  DAT_0041f120 = &_Value_default_instance_;
  DAT_0041f1f0 = &_Function_AttributesEntry_default_instance_;
  DAT_0041f200 = &_Value_default_instance_;
  DAT_0041f2a8 = &_Block_AttributesEntry_default_instance_;
  DAT_0041f2b8 = &_Value_default_instance_;
  DAT_0041f410 = &_Operation_AttributesEntry_default_instance_;
  DAT_0041f420 = &_Value_default_instance_;
  DAT_0041f4f0 = &_ValueType_default_instance_;
  DAT_0041f558 = &_TensorType_AttributesEntry_default_instance_;
  DAT_0041f568 = &_Value_default_instance_;
  DAT_0041f660 = &_ValueType_default_instance_;
  DAT_0041f668 = &_ValueType_default_instance_;
  DAT_0041f790 = &_ValueType_default_instance_;
  DAT_0041f9f0 = &_Value_default_instance_;
  DAT_0041f9f8 = &_Value_default_instance_;
  DAT_0041fa40 = 1;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _Program_FunctionsEntry_default_instance_.DefaultConstruct();
  _Program_AttributesEntry_default_instance_.DefaultConstruct();
  _Program_default_instance_.DefaultConstruct();
  _Function_BlockSpecializationsEntry_default_instance_.DefaultConstruct();
  _Function_AttributesEntry_default_instance_.DefaultConstruct();
  _Function_default_instance_.DefaultConstruct();
  _Block_AttributesEntry_default_instance_.DefaultConstruct();
  _Block_default_instance_.DefaultConstruct();
  _Argument_Binding_default_instance_.DefaultConstruct();
  _Argument_default_instance_.DefaultConstruct();
  _Operation_InputsEntry_default_instance_.DefaultConstruct();
  _Operation_AttributesEntry_default_instance_.DefaultConstruct();
  _Operation_default_instance_.DefaultConstruct();
  _NamedValueType_default_instance_.DefaultConstruct();
  _ValueType_default_instance_.DefaultConstruct();
  _TensorType_AttributesEntry_default_instance_.DefaultConstruct();
  _TensorType_default_instance_.DefaultConstruct();
  _TupleType_default_instance_.DefaultConstruct();
  _ListType_default_instance_.DefaultConstruct();
  _DictionaryType_default_instance_.DefaultConstruct();
  _Dimension_ConstantDimension_default_instance_.DefaultConstruct();
  _Dimension_UnknownDimension_default_instance_.DefaultConstruct();
  _Dimension_default_instance_.DefaultConstruct();
  _Value_ImmediateValue_default_instance_.DefaultConstruct();
  _Value_BlobFileValue_default_instance_.DefaultConstruct();
  _Value_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedFloats_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedDoubles_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedInts_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedLongInts_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedBools_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedStrings_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedBytes_default_instance_.DefaultConstruct();
  _TensorValue_default_instance_.DefaultConstruct();
  _TupleValue_default_instance_.DefaultConstruct();
  _ListValue_default_instance_.DefaultConstruct();
  _DictionaryValue_KeyValuePair_default_instance_.DefaultConstruct();
  _DictionaryValue_default_instance_.DefaultConstruct();
  _Program_FunctionsEntry_default_instance_.get_mutable()->set_default_instance(_Program_FunctionsEntry_default_instance_.get_mutable());
  _Program_FunctionsEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Program_AttributesEntry_default_instance_.get_mutable()->set_default_instance(_Program_AttributesEntry_default_instance_.get_mutable());
  _Program_AttributesEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Function_BlockSpecializationsEntry_default_instance_.get_mutable()->set_default_instance(_Function_BlockSpecializationsEntry_default_instance_.get_mutable());
  _Function_BlockSpecializationsEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Function_AttributesEntry_default_instance_.get_mutable()->set_default_instance(_Function_AttributesEntry_default_instance_.get_mutable());
  _Function_AttributesEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Block_AttributesEntry_default_instance_.get_mutable()->set_default_instance(_Block_AttributesEntry_default_instance_.get_mutable());
  _Block_AttributesEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Operation_InputsEntry_default_instance_.get_mutable()->set_default_instance(_Operation_InputsEntry_default_instance_.get_mutable());
  _Operation_InputsEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Operation_AttributesEntry_default_instance_.get_mutable()->set_default_instance(_Operation_AttributesEntry_default_instance_.get_mutable());
  _Operation_AttributesEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _NamedValueType_default_instance_.get_mutable()->type_ = const_cast< ::CoreML::Specification::MILSpec::ValueType*>(
      ::CoreML::Specification::MILSpec::ValueType::internal_default_instance());
  _TensorType_AttributesEntry_default_instance_.get_mutable()->set_default_instance(_TensorType_AttributesEntry_default_instance_.get_mutable());
  _TensorType_AttributesEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _ListType_default_instance_.get_mutable()->type_ = const_cast< ::CoreML::Specification::MILSpec::ValueType*>(
      ::CoreML::Specification::MILSpec::ValueType::internal_default_instance());
  _ListType_default_instance_.get_mutable()->length_ = const_cast< ::CoreML::Specification::MILSpec::Dimension*>(
      ::CoreML::Specification::MILSpec::Dimension::internal_default_instance());
  _DictionaryType_default_instance_.get_mutable()->keytype_ = const_cast< ::CoreML::Specification::MILSpec::ValueType*>(
      ::CoreML::Specification::MILSpec::ValueType::internal_default_instance());
  _DictionaryType_default_instance_.get_mutable()->valuetype_ = const_cast< ::CoreML::Specification::MILSpec::ValueType*>(
      ::CoreML::Specification::MILSpec::ValueType::internal_default_instance());
  _Value_default_instance_.get_mutable()->type_ = const_cast< ::CoreML::Specification::MILSpec::ValueType*>(
      ::CoreML::Specification::MILSpec::ValueType::internal_default_instance());
  _DictionaryValue_KeyValuePair_default_instance_.get_mutable()->key_ = const_cast< ::CoreML::Specification::MILSpec::Value*>(
      ::CoreML::Specification::MILSpec::Value::internal_default_instance());
  _DictionaryValue_KeyValuePair_default_instance_.get_mutable()->value_ = const_cast< ::CoreML::Specification::MILSpec::Value*>(
      ::CoreML::Specification::MILSpec::Value::internal_default_instance());
}